

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O1

bool __thiscall
unodb::
olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::iterator::try_seek(iterator *this,art_key_type search_key,bool *match,bool fwd)

{
  atomic<long> *paVar1;
  long *plVar2;
  byte bVar3;
  byte bVar4;
  byte key_byte;
  undefined1 uVar5;
  undefined8 uVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  node_ptr nVar10;
  undefined7 extraout_var_02;
  undefined7 extraout_var_03;
  undefined7 extraout_var_04;
  undefined7 extraout_var_05;
  undefined7 extraout_var_06;
  stack_entry *psVar11;
  undefined7 extraout_var_07;
  undefined7 extraout_var_08;
  long lVar12;
  ulong uVar13;
  size_t __n;
  ulong uVar14;
  ulong uVar15;
  key_prefix_snapshot kVar16;
  version_type *this_00;
  undefined7 in_register_00000081;
  node_type nVar17;
  optimistic_lock *poVar18;
  olc_node_ptr node;
  basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  *pbVar19;
  optimistic_lock *poVar20;
  find_result fVar21;
  undefined1 local_f0 [8];
  iter_result_opt cnxt;
  undefined1 local_b8 [8];
  iter_result_opt nxt;
  key_prefix_snapshot local_90;
  key_prefix_snapshot key_prefix;
  uint local_80;
  undefined4 local_7c;
  key_prefix_snapshot local_78;
  undefined1 local_70 [8];
  read_critical_section c_critical_section;
  read_critical_section parent_critical_section;
  undefined1 auStack_40 [8];
  read_critical_section node_critical_section;
  
  uVar13 = search_key.field_0._8_8_;
  local_7c = (undefined4)CONCAT71(in_register_00000081,fwd);
  if ((this->stack_).c.
      super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->stack_).c.
      super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      std::
      deque<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
      ::pop_back(&(this->stack_).c);
    } while ((this->stack_).c.
             super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             (this->stack_).c.
             super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  *match = false;
  this_00 = &c_critical_section.version;
  optimistic_lock::try_read_lock((optimistic_lock *)this_00);
  if (c_critical_section.version.version != 0) {
    node.tagged_ptr = (this->db_->root).value._M_i.tagged_ptr;
    if (node.tagged_ptr == 0) {
      olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
      ::iterator::try_seek();
      this_00 = (version_type *)((ulong)local_b8 & 0xff);
      goto LAB_00146c12;
    }
    bVar7 = optimistic_lock::check
                      ((optimistic_lock *)c_critical_section.version.version,
                       (version_type)parent_critical_section.lock);
    if (bVar7) {
      cnxt.
      super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
      _24_8_ = &this->stack_;
      nxt.
      super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
      _24_8_ = uVar13;
      local_78.u64 = search_key.field_0._0_8_;
LAB_001460a9:
      if (node.tagged_ptr == 0) {
        __assert_fail("node != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                      ,0x90a,
                      "bool unodb::olc_db<std::span<const std::byte>, std::span<const std::byte>>::iterator::try_seek(art_key_type, bool &, bool) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                     );
      }
      pbVar19 = (basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                 *)(node.tagged_ptr & 0xfffffffffffffff8);
      optimistic_lock::try_read_lock((optimistic_lock *)auStack_40);
      if (auStack_40 != (undefined1  [8])0x0) {
        bVar7 = optimistic_lock::check
                          ((optimistic_lock *)c_critical_section.version.version,
                           (version_type)parent_critical_section.lock);
        uVar6 = nxt.
                super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                ._24_8_;
        if (!bVar7) {
LAB_00146adb:
          c_critical_section.version.version = 0;
          goto LAB_00146ae3;
        }
        nVar17 = (node_type)node.tagged_ptr & (I256|I48);
        if ((node.tagged_ptr & 7) == 0) {
          if (*(long *)(c_critical_section.version.version + 8) < 1) goto LAB_00146c51;
          poVar20 = *(optimistic_lock **)c_critical_section.version.version;
          if (parent_critical_section.lock != poVar20) {
            LOCK();
            plVar2 = (long *)(c_critical_section.version.version + 8);
            lVar12 = *plVar2;
            *plVar2 = *plVar2 + -1;
            UNLOCK();
            if (SBORROW8(lVar12,1) != *plVar2 < 0) goto LAB_00146c32;
            if (parent_critical_section.lock != poVar20) goto LAB_00146adb;
          }
          LOCK();
          plVar2 = (long *)(c_critical_section.version.version + 8);
          lVar12 = *plVar2;
          *plVar2 = *plVar2 + -1;
          UNLOCK();
          if (SBORROW8(lVar12,1) != *plVar2 < 0) goto LAB_00146c32;
          c_critical_section.version.version = 0;
          if (parent_critical_section.lock == poVar20) {
            nxt.
            super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
            ._M_payload.
            super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
            ._M_payload._M_value.node.tagged_ptr._0_2_ = 0xffff;
            nxt.
            super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
            ._M_payload.
            super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
            ._M_payload._8_8_ = 0;
            nxt.
            super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
            ._M_payload.
            super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
            ._M_payload._M_value.prefix = (key_prefix_snapshot)node_critical_section.lock;
            local_b8 = (undefined1  [8])node.tagged_ptr;
            std::
            deque<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry,std::allocator<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry>>
            ::
            emplace_back<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry>
                      ((deque<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry,std::allocator<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry>>
                        *)cnxt.
                          super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                          ._24_8_,(stack_entry *)local_b8);
            uVar8 = *(uint *)&pbVar19->k_prefix;
            uVar15 = (ulong)uVar8;
            uVar14 = uVar13;
            if (uVar15 < uVar13) {
              uVar14 = uVar15;
            }
            uVar9 = memcmp((void *)search_key.field_0._0_8_,&pbVar19->children_count,uVar14);
            if ((uVar9 == 0) && (uVar9 = 0, uVar15 != uVar13)) {
              uVar9 = -(uint)(uVar13 < uVar15) | 1;
            }
            if ((((atomic<long> *)((long)auStack_40 + 8))->super___atomic_base<long>)._M_i < 1) {
LAB_00146c51:
              __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                            ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
            }
            poVar20 = *(optimistic_lock **)auStack_40;
            if (node_critical_section.lock != poVar20) {
              LOCK();
              paVar1 = (atomic<long> *)((long)auStack_40 + 8);
              lVar12 = (paVar1->super___atomic_base<long>)._M_i;
              (paVar1->super___atomic_base<long>)._M_i =
                   (paVar1->super___atomic_base<long>)._M_i + -1;
              UNLOCK();
              if (SBORROW8(lVar12,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
              goto LAB_00146c32;
              if (node_critical_section.lock != poVar20) {
                auStack_40 = (undefined1  [8])0x0;
                goto LAB_00146ae3;
              }
            }
            LOCK();
            paVar1 = (atomic<long> *)((long)auStack_40 + 8);
            lVar12 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (SBORROW8(lVar12,1) != (paVar1->super___atomic_base<long>)._M_i < 0) {
LAB_00146c32:
              __assert_fail("old_value > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                            ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
            }
            auStack_40 = (undefined1  [8])0x0;
            if (node_critical_section.lock == poVar20) {
              if (uVar9 == 0) {
                *match = true;
LAB_00146530:
                this_00 = (version_type *)CONCAT71((uint7)(uint3)(uVar8 >> 8),1);
              }
              else {
                if ((char)local_7c == '\0') {
                  if (0 < (int)uVar9) goto LAB_00146530;
                  bVar7 = try_prior(this);
                  uVar8 = (uint)CONCAT71(extraout_var_06,bVar7);
                }
                else {
                  if ((int)uVar9 < 0) goto LAB_00146530;
                  bVar7 = try_next(this);
                  uVar8 = (uint)CONCAT71(extraout_var_00,bVar7);
                }
                this_00 = (version_type *)(ulong)uVar8;
              }
              bVar7 = false;
              goto LAB_00146ab0;
            }
          }
          goto LAB_00146ae3;
        }
        local_80 = (uint)this_00;
        local_90 = (key_prefix_snapshot)
                   (pbVar19->k_prefix).u64.value.super___atomic_base<unsigned_long>._M_i;
        uVar5 = local_90.f.key_prefix_length;
        uVar14 = (ulong)local_90.f.key_prefix_length;
        local_b8 = (undefined1  [8])0x0;
        __n = 8;
        if ((ulong)nxt.
                   super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                   ._24_8_ < 8) {
          __n = nxt.
                super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                ._24_8_;
        }
        memcpy(local_b8,(void *)local_78,__n);
        uVar8 = detail::key_prefix_snapshot::get_shared_length
                          ((key_prefix_snapshot *)&local_90.f,(uint64_t)local_b8);
        if (uVar8 < (byte)uVar5) {
          if (local_90.f.key_prefix_length <= uVar8) {
            __assert_fail("i < length()",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                          ,0x248,
                          "auto unodb::detail::key_prefix_snapshot::operator[](std::size_t) const");
          }
          bVar3 = *(byte *)(local_78.u64 + uVar8);
          bVar4 = *(byte *)((long)&local_90 + (ulong)uVar8);
          if (bVar3 == bVar4) {
            __assert_fail("cmp_ != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                          ,0x93b,
                          "bool unodb::olc_db<std::span<const std::byte>, std::span<const std::byte>>::iterator::try_seek(art_key_type, bool &, bool) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                         );
          }
          if ((char)local_7c == '\0') {
            if (bVar4 <= bVar3) {
              bVar7 = try_right_most_traversal
                                (this,node,(read_critical_section *)&c_critical_section.version);
              poVar20 = node_critical_section.lock;
              uVar14 = CONCAT71(extraout_var_04,bVar7) & 0xffffffff;
              if ((((atomic<long> *)((long)auStack_40 + 8))->super___atomic_base<long>)._M_i < 1)
              goto LAB_00146c51;
              poVar18 = *(optimistic_lock **)auStack_40;
              LOCK();
              paVar1 = (atomic<long> *)((long)auStack_40 + 8);
              lVar12 = (paVar1->super___atomic_base<long>)._M_i;
              (paVar1->super___atomic_base<long>)._M_i =
                   (paVar1->super___atomic_base<long>)._M_i + -1;
              UNLOCK();
              if (node_critical_section.lock == poVar18) goto LAB_001465ea;
              olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
              ::iterator::try_seek((void *)(ulong)(0 < lVar12));
              goto LAB_001465f3;
            }
            bVar7 = try_left_most_traversal
                              (this,node,(read_critical_section *)&c_critical_section.version);
            poVar20 = node_critical_section.lock;
            if ((((atomic<long> *)((long)auStack_40 + 8))->super___atomic_base<long>)._M_i < 1)
            goto LAB_00146c51;
            poVar18 = *(optimistic_lock **)auStack_40;
            LOCK();
            paVar1 = (atomic<long> *)((long)auStack_40 + 8);
            lVar12 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (node_critical_section.lock == poVar18) {
              if (lVar12 < 1) goto LAB_00146c32;
            }
            else {
              olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
              ::iterator::try_seek((void *)(ulong)(0 < lVar12));
            }
            auStack_40 = (undefined1  [8])0x0;
            if (!bVar7 || poVar20 != poVar18) goto LAB_0014660c;
            bVar7 = try_prior(this);
            uVar8 = (uint)CONCAT71(extraout_var_01,bVar7);
LAB_0014659f:
            this_00 = (version_type *)(ulong)uVar8;
            bVar7 = false;
          }
          else {
            if (bVar4 <= bVar3) {
              bVar7 = try_right_most_traversal
                                (this,node,(read_critical_section *)&c_critical_section.version);
              poVar20 = node_critical_section.lock;
              if ((((atomic<long> *)((long)auStack_40 + 8))->super___atomic_base<long>)._M_i < 1)
              goto LAB_00146c51;
              poVar18 = *(optimistic_lock **)auStack_40;
              LOCK();
              paVar1 = (atomic<long> *)((long)auStack_40 + 8);
              lVar12 = (paVar1->super___atomic_base<long>)._M_i;
              (paVar1->super___atomic_base<long>)._M_i =
                   (paVar1->super___atomic_base<long>)._M_i + -1;
              UNLOCK();
              if (node_critical_section.lock == poVar18) {
                if (lVar12 < 1) goto LAB_00146c32;
              }
              else {
                olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
                ::iterator::try_seek((void *)(ulong)(0 < lVar12));
              }
              auStack_40 = (undefined1  [8])0x0;
              if (!bVar7 || poVar20 != poVar18) {
LAB_0014660c:
                auStack_40 = (undefined1  [8])0x0;
                kVar16 = local_78;
                goto LAB_00146613;
              }
              bVar7 = try_next(this);
              uVar8 = (uint)CONCAT71(extraout_var_03,bVar7);
              goto LAB_0014659f;
            }
            bVar7 = try_left_most_traversal
                              (this,node,(read_critical_section *)&c_critical_section.version);
            poVar20 = node_critical_section.lock;
            uVar14 = CONCAT71(extraout_var,bVar7) & 0xffffffff;
            if ((((atomic<long> *)((long)auStack_40 + 8))->super___atomic_base<long>)._M_i < 1)
            goto LAB_00146c51;
            poVar18 = *(optimistic_lock **)auStack_40;
            LOCK();
            paVar1 = (atomic<long> *)((long)auStack_40 + 8);
            lVar12 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (node_critical_section.lock == poVar18) {
LAB_001465ea:
              poVar20 = node_critical_section.lock;
              if (lVar12 < 1) goto LAB_00146c32;
            }
            else {
              olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
              ::iterator::try_seek((void *)(ulong)(0 < lVar12));
            }
LAB_001465f3:
            auStack_40 = (undefined1  [8])0x0;
            this_00 = (version_type *)
                      CONCAT71((int7)(uVar14 >> 8),(byte)uVar14 & poVar20 == poVar18);
            kVar16 = local_78;
LAB_00146615:
            bVar7 = false;
            local_78 = kVar16;
          }
          goto LAB_00146ab0;
        }
        nxt.
        super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
        _24_8_ = uVar6 - uVar14;
        if ((ulong)uVar6 < uVar14) {
LAB_00146c8f:
          __assert_fail("num_bytes <= key.size_bytes()",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                        ,0xc0,
                        "void unodb::detail::basic_art_key<std::span<const std::byte>>::shift_right(const std::size_t) [KeyType = std::span<const std::byte>]"
                       );
        }
        key_prefix.u64 = local_78.u64 + uVar14;
        key_byte = *(byte *)(local_78.u64 + uVar14);
        fVar21 = detail::
                 basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                 ::find_child(pbVar19,nVar17,key_byte);
        if (fVar21.second !=
            (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)
            0x0) {
          bVar7 = try_push(this,node,key_byte,fVar21.first,local_90,
                           (read_critical_section *)auStack_40);
          kVar16 = key_prefix;
          if (!bVar7) {
LAB_00146613:
            this_00 = (version_type *)0x0;
            goto LAB_00146615;
          }
          node.tagged_ptr = ((fVar21.second)->value)._M_i.tagged_ptr;
          if (nxt.
              super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
              ._24_8_ == 0) goto LAB_00146c8f;
          nxt.
          super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
          ._M_payload.
          super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
          _24_8_ = nxt.
                   super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                   ._24_8_ + -1;
          kVar16.u64 = key_prefix.u64 + 1;
          bVar7 = optimistic_lock::check
                            ((optimistic_lock *)auStack_40,(version_type)node_critical_section.lock)
          ;
          local_78.u64 = kVar16.u64;
          if (bVar7) {
            c_critical_section.version.version = (version_tag_type)auStack_40;
            parent_critical_section.lock = node_critical_section.lock;
            auStack_40 = (undefined1  [8])0x0;
            bVar7 = true;
            this_00 = (version_type *)(ulong)local_80;
          }
          else {
            auStack_40 = (undefined1  [8])0x0;
            bVar7 = false;
            this_00 = (version_type *)0x0;
          }
          goto LAB_00146ab0;
        }
        if ((char)local_7c == '\0') {
          detail::
          basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
          ::lte_key_byte((iter_result_opt *)local_b8,pbVar19,nVar17,*(byte *)key_prefix);
          if (nxt.
              super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
              ._M_payload._16_1_ == '\0') {
            if (*(long *)(c_critical_section.version.version + 8) < 1) goto LAB_00146c51;
            poVar20 = *(optimistic_lock **)c_critical_section.version.version;
            this_00 = (version_type *)(ulong)local_80;
            if (parent_critical_section.lock != poVar20) {
              LOCK();
              plVar2 = (long *)(c_critical_section.version.version + 8);
              lVar12 = *plVar2;
              *plVar2 = *plVar2 + -1;
              UNLOCK();
              if (SBORROW8(lVar12,1) != *plVar2 < 0) goto LAB_00146c32;
              if (parent_critical_section.lock != poVar20) goto LAB_00146bb4;
            }
            LOCK();
            plVar2 = (long *)(c_critical_section.version.version + 8);
            lVar12 = *plVar2;
            *plVar2 = *plVar2 + -1;
            UNLOCK();
            if (SBORROW8(lVar12,1) != *plVar2 < 0) goto LAB_00146c32;
            c_critical_section.version.version = 0;
            if (parent_critical_section.lock == poVar20) {
              if ((((atomic<long> *)((long)auStack_40 + 8))->super___atomic_base<long>)._M_i < 1)
              goto LAB_00146c51;
              poVar20 = *(optimistic_lock **)auStack_40;
              if (node_critical_section.lock != poVar20) {
                LOCK();
                paVar1 = (atomic<long> *)((long)auStack_40 + 8);
                lVar12 = (paVar1->super___atomic_base<long>)._M_i;
                (paVar1->super___atomic_base<long>)._M_i =
                     (paVar1->super___atomic_base<long>)._M_i + -1;
                UNLOCK();
                if (SBORROW8(lVar12,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
                goto LAB_00146c32;
                if (node_critical_section.lock != poVar20) goto LAB_00146be0;
              }
              LOCK();
              paVar1 = (atomic<long> *)((long)auStack_40 + 8);
              lVar12 = (paVar1->super___atomic_base<long>)._M_i;
              (paVar1->super___atomic_base<long>)._M_i =
                   (paVar1->super___atomic_base<long>)._M_i + -1;
              UNLOCK();
              if (SBORROW8(lVar12,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
              goto LAB_00146c32;
              auStack_40 = (undefined1  [8])0x0;
              if (node_critical_section.lock == poVar20) {
                if ((this->stack_).c.
                    super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                    (this->stack_).c.
                    super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur) {
                  pop(this);
                }
                do {
                  if ((this->stack_).c.
                      super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                      (this->stack_).c.
                      super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_00146aa3;
                  psVar11 = top(this);
                  uVar14 = (psVar11->super_iter_result).node.tagged_ptr;
                  pbVar19 = (basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                             *)(uVar14 & 0xfffffffffffffff8);
                  c_critical_section.lock = (optimistic_lock *)psVar11->version;
                  LOCK();
                  paVar1 = &(pbVar19->super_header_type).m_lock.read_lock_count;
                  (paVar1->super___atomic_base<long>)._M_i =
                       (paVar1->super___atomic_base<long>)._M_i + 1;
                  UNLOCK();
                  local_70 = (undefined1  [8])pbVar19;
                  bVar7 = optimistic_lock::check
                                    ((optimistic_lock *)pbVar19,
                                     (version_type)c_critical_section.lock);
                  if (bVar7) {
                    nVar17 = (node_type)uVar14;
                    detail::
                    basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                    ::prior((iter_result_opt *)local_f0,pbVar19,nVar17 & (I256|I48),
                            (psVar11->super_iter_result).child_index);
                    if (cnxt.
                        super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                        ._M_payload.
                        super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                        ._M_payload._16_1_ == '\x01') {
                      nVar10 = detail::
                               basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                               ::get_child(pbVar19,nVar17 & (I256|I48),
                                           (psVar11->super_iter_result).child_index);
                      bVar7 = optimistic_lock::check
                                        ((optimistic_lock *)local_70,
                                         (version_type)c_critical_section.lock);
                      if (!bVar7) goto LAB_00146a7a;
                      bVar7 = try_right_most_traversal
                                        (this,(olc_node_ptr)nVar10.tagged_ptr,
                                         (read_critical_section *)local_70);
                      this_00 = (version_type *)(CONCAT71(extraout_var_08,bVar7) & 0xffffffff);
                      bVar7 = false;
                    }
                    else {
                      pop(this);
                      if ((((header_type *)local_70)->m_lock).read_lock_count.
                          super___atomic_base<long>._M_i < 1) goto LAB_00146c51;
                      poVar20 = (optimistic_lock *)
                                (((header_type *)local_70)->m_lock).version.version.
                                super___atomic_base<unsigned_long>._M_i;
                      bVar7 = c_critical_section.lock == poVar20;
                      if (bVar7) {
LAB_00146a4b:
                        LOCK();
                        paVar1 = &(((header_type *)local_70)->m_lock).read_lock_count;
                        lVar12 = (paVar1->super___atomic_base<long>)._M_i;
                        (paVar1->super___atomic_base<long>)._M_i =
                             (paVar1->super___atomic_base<long>)._M_i + -1;
                        UNLOCK();
                        if (SBORROW8(lVar12,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
                        goto LAB_00146c32;
                      }
                      else {
                        LOCK();
                        paVar1 = &(((header_type *)local_70)->m_lock).read_lock_count;
                        lVar12 = (paVar1->super___atomic_base<long>)._M_i;
                        (paVar1->super___atomic_base<long>)._M_i =
                             (paVar1->super___atomic_base<long>)._M_i + -1;
                        UNLOCK();
                        if (SBORROW8(lVar12,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
                        goto LAB_00146c32;
                        if (c_critical_section.lock == poVar20) goto LAB_00146a4b;
                      }
                      local_70 = (undefined1  [8])0x0;
                      this_00 = (version_type *)
                                CONCAT71((int7)((ulong)this_00 >> 8),
                                         (byte)this_00 & c_critical_section.lock == poVar20);
                    }
                  }
                  else {
LAB_00146a7a:
                    local_70 = (undefined1  [8])0x0;
                    bVar7 = false;
                    this_00 = (version_type *)0x0;
                  }
                  optimistic_lock::read_critical_section::~read_critical_section
                            ((read_critical_section *)local_70);
                } while (bVar7);
                goto LAB_00146aa5;
              }
            }
          }
          else {
            uVar5 = nxt.
                    super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                    ._M_payload._M_value.node.tagged_ptr._1_1_;
            nVar10 = detail::
                     basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                     ::get_child(pbVar19,nVar17,
                                 nxt.
                                 super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                                 ._M_payload._M_value.node.tagged_ptr._1_1_);
            bVar7 = optimistic_lock::check
                              ((optimistic_lock *)auStack_40,
                               (version_type)node_critical_section.lock);
            if (!bVar7) goto LAB_00146be0;
            if (*(long *)(c_critical_section.version.version + 8) < 1) goto LAB_00146c51;
            poVar20 = *(optimistic_lock **)c_critical_section.version.version;
            if (parent_critical_section.lock != poVar20) {
              LOCK();
              plVar2 = (long *)(c_critical_section.version.version + 8);
              lVar12 = *plVar2;
              *plVar2 = *plVar2 + -1;
              UNLOCK();
              if (SBORROW8(lVar12,1) != *plVar2 < 0) goto LAB_00146c32;
              if (parent_critical_section.lock != poVar20) goto LAB_00146bb4;
            }
            LOCK();
            plVar2 = (long *)(c_critical_section.version.version + 8);
            lVar12 = *plVar2;
            *plVar2 = *plVar2 + -1;
            UNLOCK();
            if (SBORROW8(lVar12,1) != *plVar2 < 0) goto LAB_00146c32;
            c_critical_section.version.version = 0;
            if (parent_critical_section.lock == poVar20) {
              bVar7 = try_push(this,node,
                               nxt.
                               super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                               ._M_payload._M_value.node.tagged_ptr._0_1_,uVar5,
                               (key_prefix_snapshot)
                               nxt.
                               super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                               ._M_payload._8_8_,(read_critical_section *)auStack_40);
              if (bVar7) {
                bVar7 = try_right_most_traversal
                                  (this,(olc_node_ptr)nVar10.tagged_ptr,
                                   (read_critical_section *)auStack_40);
                uVar8 = (uint)CONCAT71(extraout_var_05,bVar7);
                goto LAB_001466ee;
              }
            }
          }
LAB_00146be8:
          this_00 = (version_type *)0x0;
        }
        else {
          detail::
          basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
          ::gte_key_byte((iter_result_opt *)local_b8,pbVar19,nVar17,*(byte *)key_prefix);
          if (nxt.
              super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
              ._M_payload._16_1_ == '\0') {
            if (*(long *)(c_critical_section.version.version + 8) < 1) goto LAB_00146c51;
            poVar20 = *(optimistic_lock **)c_critical_section.version.version;
            this_00 = (version_type *)(ulong)local_80;
            if (parent_critical_section.lock != poVar20) {
              LOCK();
              plVar2 = (long *)(c_critical_section.version.version + 8);
              lVar12 = *plVar2;
              *plVar2 = *plVar2 + -1;
              UNLOCK();
              if (SBORROW8(lVar12,1) != *plVar2 < 0) goto LAB_00146c32;
              if (parent_critical_section.lock != poVar20) {
LAB_00146bb4:
                c_critical_section.version.version = 0;
                goto LAB_00146be8;
              }
            }
            LOCK();
            plVar2 = (long *)(c_critical_section.version.version + 8);
            lVar12 = *plVar2;
            *plVar2 = *plVar2 + -1;
            UNLOCK();
            if (SBORROW8(lVar12,1) != *plVar2 < 0) goto LAB_00146c32;
            c_critical_section.version.version = 0;
            if (parent_critical_section.lock == poVar20) {
              if ((((atomic<long> *)((long)auStack_40 + 8))->super___atomic_base<long>)._M_i < 1)
              goto LAB_00146c51;
              poVar20 = *(optimistic_lock **)auStack_40;
              if (node_critical_section.lock != poVar20) {
                LOCK();
                paVar1 = (atomic<long> *)((long)auStack_40 + 8);
                lVar12 = (paVar1->super___atomic_base<long>)._M_i;
                (paVar1->super___atomic_base<long>)._M_i =
                     (paVar1->super___atomic_base<long>)._M_i + -1;
                UNLOCK();
                if (SBORROW8(lVar12,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
                goto LAB_00146c32;
                if (node_critical_section.lock != poVar20) goto LAB_00146be0;
              }
              LOCK();
              paVar1 = (atomic<long> *)((long)auStack_40 + 8);
              lVar12 = (paVar1->super___atomic_base<long>)._M_i;
              (paVar1->super___atomic_base<long>)._M_i =
                   (paVar1->super___atomic_base<long>)._M_i + -1;
              UNLOCK();
              if (SBORROW8(lVar12,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
              goto LAB_00146c32;
              auStack_40 = (undefined1  [8])0x0;
              if (node_critical_section.lock == poVar20) {
                if ((this->stack_).c.
                    super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                    (this->stack_).c.
                    super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur) {
                  pop(this);
                }
                do {
                  if ((this->stack_).c.
                      super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                      (this->stack_).c.
                      super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_00146aa3;
                  psVar11 = top(this);
                  uVar14 = (psVar11->super_iter_result).node.tagged_ptr;
                  pbVar19 = (basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                             *)(uVar14 & 0xfffffffffffffff8);
                  c_critical_section.lock = (optimistic_lock *)psVar11->version;
                  LOCK();
                  paVar1 = &(pbVar19->super_header_type).m_lock.read_lock_count;
                  (paVar1->super___atomic_base<long>)._M_i =
                       (paVar1->super___atomic_base<long>)._M_i + 1;
                  UNLOCK();
                  local_70 = (undefined1  [8])pbVar19;
                  bVar7 = optimistic_lock::check
                                    ((optimistic_lock *)pbVar19,
                                     (version_type)c_critical_section.lock);
                  if (bVar7) {
                    nVar17 = (node_type)uVar14;
                    detail::
                    basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                    ::next((iter_result_opt *)local_f0,pbVar19,nVar17 & (I256|I48),
                           (psVar11->super_iter_result).child_index);
                    if (cnxt.
                        super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                        ._M_payload.
                        super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                        ._M_payload._16_1_ == '\x01') {
                      nVar10 = detail::
                               basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                               ::get_child(pbVar19,nVar17 & (I256|I48),
                                           (psVar11->super_iter_result).child_index);
                      bVar7 = optimistic_lock::check
                                        ((optimistic_lock *)local_70,
                                         (version_type)c_critical_section.lock);
                      if (!bVar7) goto LAB_001468b0;
                      bVar7 = try_left_most_traversal
                                        (this,(olc_node_ptr)nVar10.tagged_ptr,
                                         (read_critical_section *)local_70);
                      this_00 = (version_type *)(CONCAT71(extraout_var_07,bVar7) & 0xffffffff);
                      bVar7 = false;
                    }
                    else {
                      pop(this);
                      if ((((header_type *)local_70)->m_lock).read_lock_count.
                          super___atomic_base<long>._M_i < 1) goto LAB_00146c51;
                      poVar20 = (optimistic_lock *)
                                (((header_type *)local_70)->m_lock).version.version.
                                super___atomic_base<unsigned_long>._M_i;
                      bVar7 = c_critical_section.lock == poVar20;
                      if (bVar7) {
LAB_0014687e:
                        LOCK();
                        paVar1 = &(((header_type *)local_70)->m_lock).read_lock_count;
                        lVar12 = (paVar1->super___atomic_base<long>)._M_i;
                        (paVar1->super___atomic_base<long>)._M_i =
                             (paVar1->super___atomic_base<long>)._M_i + -1;
                        UNLOCK();
                        if (SBORROW8(lVar12,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
                        goto LAB_00146c32;
                      }
                      else {
                        LOCK();
                        paVar1 = &(((header_type *)local_70)->m_lock).read_lock_count;
                        lVar12 = (paVar1->super___atomic_base<long>)._M_i;
                        (paVar1->super___atomic_base<long>)._M_i =
                             (paVar1->super___atomic_base<long>)._M_i + -1;
                        UNLOCK();
                        if (SBORROW8(lVar12,1) != (paVar1->super___atomic_base<long>)._M_i < 0)
                        goto LAB_00146c32;
                        if (c_critical_section.lock == poVar20) goto LAB_0014687e;
                      }
                      local_70 = (undefined1  [8])0x0;
                      this_00 = (version_type *)
                                CONCAT71((int7)((ulong)this_00 >> 8),
                                         (byte)this_00 & c_critical_section.lock == poVar20);
                    }
                  }
                  else {
LAB_001468b0:
                    local_70 = (undefined1  [8])0x0;
                    bVar7 = false;
                    this_00 = (version_type *)0x0;
                  }
                  optimistic_lock::read_critical_section::~read_critical_section
                            ((read_critical_section *)local_70);
                } while (bVar7);
                goto LAB_00146aa5;
              }
            }
            goto LAB_00146be8;
          }
          uVar5 = nxt.
                  super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                  ._M_payload._M_value.node.tagged_ptr._1_1_;
          nVar10 = detail::
                   basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                   ::get_child(pbVar19,nVar17,
                               nxt.
                               super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                               ._M_payload._M_value.node.tagged_ptr._1_1_);
          bVar7 = optimistic_lock::check
                            ((optimistic_lock *)auStack_40,(version_type)node_critical_section.lock)
          ;
          if (!bVar7) {
LAB_00146be0:
            auStack_40 = (undefined1  [8])0x0;
            goto LAB_00146be8;
          }
          if (*(long *)(c_critical_section.version.version + 8) < 1) goto LAB_00146c51;
          poVar20 = *(optimistic_lock **)c_critical_section.version.version;
          if (parent_critical_section.lock != poVar20) {
            LOCK();
            plVar2 = (long *)(c_critical_section.version.version + 8);
            lVar12 = *plVar2;
            *plVar2 = *plVar2 + -1;
            UNLOCK();
            if (SBORROW8(lVar12,1) != *plVar2 < 0) goto LAB_00146c32;
            if (parent_critical_section.lock != poVar20) goto LAB_00146bb4;
          }
          LOCK();
          plVar2 = (long *)(c_critical_section.version.version + 8);
          lVar12 = *plVar2;
          *plVar2 = *plVar2 + -1;
          UNLOCK();
          if (SBORROW8(lVar12,1) != *plVar2 < 0) goto LAB_00146c32;
          c_critical_section.version.version = 0;
          if (parent_critical_section.lock != poVar20) goto LAB_00146be8;
          bVar7 = try_push(this,node,
                           nxt.
                           super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                           ._M_payload._M_value.node.tagged_ptr._0_1_,uVar5,
                           (key_prefix_snapshot)
                           nxt.
                           super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                           ._M_payload._8_8_,(read_critical_section *)auStack_40);
          if (!bVar7) goto LAB_00146be8;
          bVar7 = try_left_most_traversal
                            (this,(olc_node_ptr)nVar10.tagged_ptr,
                             (read_critical_section *)auStack_40);
          uVar8 = (uint)CONCAT71(extraout_var_02,bVar7);
LAB_001466ee:
          this_00 = (version_type *)(ulong)uVar8;
        }
        goto LAB_00146aa5;
      }
LAB_00146ae3:
      bVar7 = false;
      this_00 = (version_type *)0x0;
      goto LAB_00146ab0;
    }
    c_critical_section.version.version = 0;
  }
  this_00 = (version_type *)0x0;
LAB_00146c12:
  optimistic_lock::read_critical_section::~read_critical_section
            ((read_critical_section *)&c_critical_section.version);
  return (bool)((byte)this_00 & 1);
LAB_00146aa3:
  this_00 = (version_type *)CONCAT71((int7)((ulong)this_00 >> 8),1);
LAB_00146aa5:
  bVar7 = false;
  local_78 = key_prefix;
LAB_00146ab0:
  optimistic_lock::read_critical_section::~read_critical_section
            ((read_critical_section *)auStack_40);
  if (!bVar7) goto LAB_00146c12;
  goto LAB_001460a9;
}

Assistant:

bool olc_db<Key, Value>::iterator::try_seek(art_key_type search_key,
                                            bool& match, bool fwd) {
  invalidate();   // invalidate the iterator (clear the stack).
  match = false;  // unless we wind up with an exact match.
  auto parent_critical_section = db_.root_pointer_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(parent_critical_section.must_restart())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return false;
    // LCOV_EXCL_STOP
  }
  auto node{db_.root.load()};
  if (UNODB_DETAIL_UNLIKELY(node == nullptr)) {
    return UNODB_DETAIL_LIKELY(parent_critical_section.try_read_unlock());
  }
  // A check() is required before acting on [node] by taking the lock.
  if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return false;
    // LCOV_EXCL_STOP
  }
  const auto k = search_key;
  auto remaining_key{k};
  while (true) {
    UNODB_DETAIL_ASSERT(node != nullptr);
    // Lock version chaining (node and parent)
    auto node_critical_section = node_ptr_lock(node).try_read_lock();
    if (UNODB_DETAIL_UNLIKELY(node_critical_section.must_restart()))
      return false;  // LCOV_EXCL_LINE
    // TODO(thompsonbry) Should be redundant.  Checked before entering
    // the while() loop and at the bottom of the while() loop.
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) return false;
    // Note: We DO NOT unlock the parent_critical_section here.  It is
    // done below along all code paths.
    const auto node_type = node.type();
    if (node_type == node_type::LEAF) {
      if (UNODB_DETAIL_UNLIKELY(
              !parent_critical_section.try_read_unlock()))  // unlock parent
        return false;                                       // LCOV_EXCL_LINE
      const auto* const leaf{node.template ptr<leaf_type*>()};
      if (UNODB_DETAIL_UNLIKELY(!try_push_leaf(node, node_critical_section)))
        return false;  // LCOV_EXCL_LINE
      const auto cmp_ = leaf->cmp(k);
      if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
        return false;  // LCOV_EXCL_LINE
      if (cmp_ == 0) {
        match = true;
        return true;  // done
      }
      if (fwd) {  // GTE semantics
        // if search_key < leaf, use leaf, else next().
        return (cmp_ < 0) ? true : try_next();
      }
      // LTE semantics: if search_key > leaf, use leaf, else prior().
      return (cmp_ > 0) ? true : try_prior();
    }
    UNODB_DETAIL_ASSERT(node_type != node_type::LEAF);
    auto* const inode{node.template ptr<inode_type*>()};  // some internal node.
    const auto key_prefix{inode->get_key_prefix().get_snapshot()};  // prefix
    const auto key_prefix_length{key_prefix.length()};  // length of that prefix
    const auto shared_length = key_prefix.get_shared_length(
        remaining_key.get_u64());  // #of prefix bytes matched.
    if (shared_length < key_prefix_length) {
      // We have visited an internal node whose prefix is longer than
      // the bytes in the key that we need to match.  To figure out
      // whether the search key would be located before or after the
      // current internal node, we need to compare the respective key
      // spans lexicographically.  Since we have [shared_length] bytes
      // in common, we know that the next byte will tell us the
      // relative ordering of the key vs the prefix. So now we compare
      // prefix and key and the first byte where they differ.
      const auto cmp_ = static_cast<int>(remaining_key[shared_length]) -
                        static_cast<int>(key_prefix[shared_length]);
      UNODB_DETAIL_ASSERT(cmp_ != 0);
      if (fwd) {
        // Note: parent_critical_section is unlocked along all paths
        // by try_(left|right)_most_traversal
        if (cmp_ < 0) {
          // FWD and the search key is ordered before this node.  We
          // want the left-most leaf under the node.
          return unlock_and_return(
              node_critical_section,
              try_left_most_traversal(node, parent_critical_section));
        }
        // FWD and the search key is ordered after this node.  Right
        // most descent and then next().
        return unlock_and_return(
                   node_critical_section,
                   try_right_most_traversal(node, parent_critical_section)) &&
               try_next();
      }
      // reverse traversal
      if (cmp_ < 0) {
        // REV and the search key is ordered before this node.  We
        // want the preceeding key.
        return unlock_and_return(
                   node_critical_section,
                   try_left_most_traversal(node, parent_critical_section)) &&
               try_prior();
      }
      // REV and the search key is ordered after this node.
      return unlock_and_return(
          node_critical_section,
          try_right_most_traversal(node, parent_critical_section));
    }
    remaining_key.shift_right(key_prefix_length);
    const auto res = inode->find_child(node_type, remaining_key[0]);
    if (res.second == nullptr) {
      // We are on a key byte during the descent that is not mapped by
      // the current node.  Where we go next depends on whether we are
      // doing forward or reverse traversal.
      if (fwd) {
        // FWD: Take the next child_index that is mapped in the data
        // and then do a left-most descent to land on the key that is
        // the immediate successor of the desired key in the data.
        //
        // Note: We are probing with a key byte which does not appear
        // in our list of keys (this was verified above) so this will
        // always be the index the first entry whose key byte is
        // greater-than the probe value and [false] if there is no
        // such entry.
        //
        // Note: [node] has not been pushed onto the stack yet!
        auto nxt = inode->gte_key_byte(node_type, remaining_key[0]);
        if (!nxt) {
          // Pop entries off the stack until we find one with a
          // right-sibling of the path we took to this node and then
          // do a left-most descent under that right-sibling. If there
          // is no such parent, we will wind up with an empty stack
          // (aka the end() iterator) and return that state.
          if (UNODB_DETAIL_UNLIKELY(
                  !parent_critical_section.try_read_unlock()))  // unlock parent
            return false;  // LCOV_EXCL_LINE
          if (UNODB_DETAIL_UNLIKELY(
                  !node_critical_section.try_read_unlock()))  // unlock node
            return false;                                     // LCOV_EXCL_LINE
          if (!empty()) pop();
          while (!empty()) {
            const auto& centry = top();
            const auto cnode{centry.node};  // a possible parent from the stack.
            auto c_critical_section(
                node_ptr_lock(cnode).rehydrate_read_lock(centry.version));
            if (UNODB_DETAIL_UNLIKELY(!c_critical_section.check()))
              return false;  // LCOV_EXCL_LINE
            auto* const icnode{cnode.template ptr<inode_type*>()};
            const auto cnxt = icnode->next(
                cnode.type(), centry.child_index);  // right-sibling.
            if (cnxt) {
              auto nchild = icnode->get_child(
                  cnode.type(), centry.child_index);  // get the child
              if (UNODB_DETAIL_UNLIKELY(
                      !c_critical_section.check()))  // before using [nchild]
                return false;                        // LCOV_EXCL_LINE
              return try_left_most_traversal(nchild, c_critical_section);
            }
            pop();
            if (UNODB_DETAIL_UNLIKELY(!c_critical_section.try_read_unlock()))
              return false;  // LCOV_EXCL_LINE
          }
          return true;  // stack is empty (aka end()).
        }
        const auto& tmp = nxt.value();  // unwrap.
        const auto child_index = tmp.child_index;
        const auto child =
            inode->get_child(node_type, child_index);  // get child
        if (UNODB_DETAIL_UNLIKELY(
                !node_critical_section.check()))  // before using [child]
          return false;                           // LCOV_EXCL_LINE
        if (UNODB_DETAIL_UNLIKELY(
                !parent_critical_section.try_read_unlock()))  // unlock parent
          return false;                                       // LCOV_EXCL_LINE
        // push the path we took
        if (UNODB_DETAIL_UNLIKELY(!try_push(node, tmp.key_byte, child_index,
                                            tmp.prefix, node_critical_section)))
          return false;  // LCOV_EXCL_LINE
        return try_left_most_traversal(child, node_critical_section);
      }
      // REV: Take the prior child_index that is mapped and then do
      // a right-most descent to land on the key that is the
      // immediate precessor of the desired key in the data.
      auto nxt = inode->lte_key_byte(node_type, remaining_key[0]);
      if (!nxt) {
        // Pop off the current entry until we find one with a
        // left-sibling and then do a right-most descent under that
        // left-sibling.  In the extreme case there is no such
        // previous entry and we will wind up with an empty stack.
        if (UNODB_DETAIL_UNLIKELY(
                !parent_critical_section.try_read_unlock()))  // unlock parent
          return false;                                       // LCOV_EXCL_LINE
        if (UNODB_DETAIL_UNLIKELY(
                !node_critical_section.try_read_unlock()))  // unlock node
          return false;                                     // LCOV_EXCL_LINE
        if (!empty()) pop();
        while (!empty()) {
          const auto& centry = top();
          const auto cnode{centry.node};  // a possible parent from stack
          auto c_critical_section(
              node_ptr_lock(cnode).rehydrate_read_lock(centry.version));
          if (UNODB_DETAIL_UNLIKELY(!c_critical_section.check()))
            return false;  // LCOV_EXCL_LINE
          auto* const icnode{cnode.template ptr<inode_type*>()};
          const auto cnxt =
              icnode->prior(cnode.type(), centry.child_index);  // left-sibling.
          if (cnxt) {
            auto nchild = icnode->get_child(
                cnode.type(), centry.child_index);  // get the child
            if (UNODB_DETAIL_UNLIKELY(
                    !c_critical_section.check()))  // before using [nchild]
              return false;                        // LCOV_EXCL_LINE
            return try_right_most_traversal(nchild, c_critical_section);
          }
          pop();
          if (UNODB_DETAIL_UNLIKELY(!c_critical_section.try_read_unlock()))
            return false;  // LCOV_EXCL_LINE
        }
        return true;  // stack is empty (aka end()).
      }
      const auto& tmp = nxt.value();  // unwrap.
      const auto child_index = tmp.child_index;
      const auto child =
          inode->get_child(node_type, child_index);  // get the child
      if (UNODB_DETAIL_UNLIKELY(
              !node_critical_section.check()))  // before using [child]
        return false;                           // LCOV_EXCL_LINE
      if (UNODB_DETAIL_UNLIKELY(
              !parent_critical_section.try_read_unlock()))  // unlock parent
        return false;                                       // LCOV_EXCL_LINE
      // push the path we took
      if (UNODB_DETAIL_UNLIKELY(!try_push(node, tmp.key_byte, child_index,
                                          tmp.prefix, node_critical_section)))
        return false;  // LCOV_EXCL_LINE
      return try_right_most_traversal(child, node_critical_section);
    }
    // Simple case. There is a child for the current key byte.
    const auto child_index{res.first};
    const auto* const child{res.second};
    if (UNODB_DETAIL_UNLIKELY(!try_push(node, remaining_key[0], child_index,
                                        key_prefix, node_critical_section)))
      return false;  // LCOV_EXCL_LINE
    node = *child;
    remaining_key.shift_right(1);
    // check node before using [child] and before we std::move() the RCS.
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check()))
      return false;  // LCOV_EXCL_LINE
    // Move RCS (will check invariant at top of loop)
    parent_critical_section = std::move(node_critical_section);
  }  // while ( true )
  UNODB_DETAIL_CANNOT_HAPPEN();
}